

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

xmlParserInputBufferPtr xmlParserInputBufferCreateFilename(char *URI,xmlCharEncoding enc)

{
  int iVar1;
  xmlParserInputBufferCreateFilenameFunc *pp_Var2;
  xmlParserInputBufferPtr pxVar3;
  int flags;
  xmlParserInputBufferPtr ret;
  xmlParserInputBufferPtr local_18;
  
  pp_Var2 = __xmlParserInputBufferCreateFilenameValue();
  if (*pp_Var2 != (xmlParserInputBufferCreateFilenameFunc)0x0) {
    pp_Var2 = __xmlParserInputBufferCreateFilenameValue();
    pxVar3 = (**pp_Var2)(URI,enc);
    return pxVar3;
  }
  iVar1 = xmlParserInputBufferCreateUrl(URI,enc,flags,&local_18);
  if ((iVar1 != 0) && (iVar1 != 0x5f4)) {
    iVar1 = xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                          (void *)0x0,(xmlNode *)0x0,8,iVar1,XML_ERR_ERROR,URI,0,(char *)0x0,
                          (char *)0x0,(char *)0x0,0,0,"Failed to open file\n");
    if (iVar1 < 0) {
      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,8,
                          (xmlError *)0x0);
    }
  }
  return local_18;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateFilename(const char *URI, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;
    int code;

    if (xmlParserInputBufferCreateFilenameValue != NULL)
        return(xmlParserInputBufferCreateFilenameValue(URI, enc));

    code = xmlParserInputBufferCreateUrl(URI, enc, 0, &ret);

    /*
     * xmlParserInputBufferCreateFilename has no way to return
     * the kind of error although it really is crucial.
     * All we can do is to set the global error.
     */
    if ((code != XML_ERR_OK) && (code != XML_IO_ENOENT)) {
        if (xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_IO, code,
                          XML_ERR_ERROR, URI, 0, NULL, NULL, NULL, 0, 0,
                          "Failed to open file\n") < 0)
            xmlRaiseMemoryError(NULL, NULL, NULL, XML_FROM_IO, NULL);
    }

    return(ret);
}